

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O3

void Au_NtkTerSimulate(Au_Ntk_t *p)

{
  ulong *puVar1;
  Au_Man_t *pAVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  
  if (p->pMan->pFuncs != (Abc_Nam_t *)0x0) {
    __assert_fail("p->pMan->pFuncs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieNew.c"
                  ,0x57e,"void Au_NtkTerSimulate(Au_Ntk_t *)");
  }
  uVar5 = 0;
  printf("Collapsing model \"%s\"...\n",p->pName);
  uVar7 = (p->vPis).nSize;
  uVar4 = (ulong)uVar7;
  if (0 < (int)uVar7) {
    lVar3 = 0;
    do {
      if ((int)uVar4 <= lVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar7 = (p->vPis).pArray[lVar3];
      puVar1 = (ulong *)((long)(p->vPages).pArray[(int)uVar7 >> 0xc] + (ulong)((uVar7 & 0xfff) << 4)
                        );
      *puVar1 = *puVar1 | 0xc0000000;
      lVar3 = lVar3 + 1;
      uVar4 = (ulong)(p->vPis).nSize;
    } while (lVar3 < (long)uVar4);
  }
  pAVar2 = p->pMan;
  pAVar2->nPortsC0 = 0.0;
  pAVar2->nPortsC1 = 0.0;
  pAVar2->nPortsNC = 0.0;
  Au_NtkTerSimulate_rec(p);
  lVar3 = (long)(p->vPos).nSize;
  uVar4 = 0;
  if (0 < lVar3) {
    lVar6 = 0;
    uVar4 = 0;
    uVar5 = 0;
    do {
      uVar7 = (p->vPos).pArray[lVar6];
      uVar7 = *(uint *)((long)(p->vPages).pArray[(int)uVar7 >> 0xc] + (ulong)((uVar7 & 0xfff) << 4))
              >> 0x1e;
      uVar4 = (ulong)((int)uVar4 + (uint)(uVar7 == 2));
      uVar5 = uVar5 + (uVar7 == 1);
      lVar6 = lVar6 + 1;
    } while (lVar3 != lVar6);
  }
  printf("Const0 outputs =%15d. Const1 outputs =%15d.  Total outputs =%15d.\n",(ulong)uVar5,uVar4,
         (ulong)(uint)p->nObjs[3]);
  printf(
        "Const0 ports =  %.0f. Const1  ports =  %.0f. Non-const ports=  %.0f.  Total ports =  %.0f.\n"
        );
  return;
}

Assistant:

void Au_NtkTerSimulate( Au_Ntk_t * p )
{
    Au_Obj_t * pTerm;
    int i, Counter[2] = {0};
    assert( p->pMan->pFuncs == NULL );
    printf( "Collapsing model \"%s\"...\n", Au_NtkName(p) );
    // create PIs
    Au_NtkForEachPi( p, pTerm, i )
        Au_ObjSetXsim( pTerm, AU_VALX );
    // recursively flatten hierarchy
    p->pMan->nPortsC0 = 0;
    p->pMan->nPortsC1 = 0;
    p->pMan->nPortsNC = 0;
    Au_NtkTerSimulate_rec( p );
    // analyze outputs
    Au_NtkForEachPo( p, pTerm, i )
        if ( Au_ObjGetXsim(pTerm) == AU_VAL0 )
            Counter[0]++;
        else if ( Au_ObjGetXsim(pTerm) == AU_VAL1 )
            Counter[1]++;
    // print results
    printf( "Const0 outputs =%15d. Const1 outputs =%15d.  Total outputs =%15d.\n", 
        Counter[0], Counter[1], Au_NtkPoNum(p) );
    printf( "Const0 ports =  %.0f. Const1  ports =  %.0f. Non-const ports=  %.0f.  Total ports =  %.0f.\n", 
        p->pMan->nPortsC0, p->pMan->nPortsC1, p->pMan->nPortsNC, p->pMan->nPortsC0 + p->pMan->nPortsC1 + p->pMan->nPortsNC );
}